

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

bool Host_CheckForConnects(void *userdata)

{
  in_addr_t iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  in_port_t iVar5;
  in_addr iVar6;
  bool bVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  sockaddr_in *psVar11;
  int num_connected;
  int num_needed;
  PreGamePacket packet;
  
LAB_004662ad:
  do {
    psVar11 = PreGet(&packet,0x44,false);
    num_needed = (int)userdata;
    if (psVar11 == (sockaddr_in *)0x0) break;
    if (packet.Fake == '0') {
      if (packet.Message == '\x02') {
        uVar10 = FindNode(psVar11);
        if ((int)uVar10 < 0) goto LAB_004662ad;
        (*StartScreen->_vptr_FStartupScreen[7])
                  (StartScreen,"Got disconnect from node %d.",(ulong)uVar10);
        sVar8 = doomcom.numnodes + -1;
        doomcom.numnodes = sVar8;
        num_connected = (int)sVar8;
        psVar11 = sendaddress + (ulong)uVar10 + 1;
        for (; (int)uVar10 < num_connected; uVar10 = uVar10 + 1) {
          iVar5 = psVar11->sin_port;
          iVar6.s_addr = (psVar11->sin_addr).s_addr;
          uVar4 = *(undefined8 *)psVar11->sin_zero;
          psVar11[-1].sin_family = psVar11->sin_family;
          psVar11[-1].sin_port = iVar5;
          psVar11[-1].sin_addr = (in_addr)iVar6.s_addr;
          *(undefined8 *)psVar11[-1].sin_zero = uVar4;
          psVar11 = psVar11 + 1;
        }
      }
      else {
        if (packet.Message != '\0') goto LAB_004662ad;
        iVar9 = FindNode(psVar11);
        num_connected = (int)doomcom.numnodes;
        if (num_connected == num_needed) {
          if (iVar9 == -1) {
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Got extra connect from %d.%d.%d.%d:%d",
                       (ulong)(byte)(psVar11->sin_addr).s_addr,
                       (ulong)*(byte *)((long)&(psVar11->sin_addr).s_addr + 1),
                       (ulong)*(byte *)((long)&(psVar11->sin_addr).s_addr + 2),
                       (ulong)*(byte *)((long)&(psVar11->sin_addr).s_addr + 3),
                       (uint)psVar11->sin_port);
            packet.Message = '\x05';
            PreSend(&packet,2,psVar11);
          }
          goto LAB_004662ad;
        }
        if (iVar9 == -1) {
          doomcom.numnodes = doomcom.numnodes + 1;
          iVar5 = psVar11->sin_port;
          iVar1 = (psVar11->sin_addr).s_addr;
          uVar2 = *(undefined4 *)psVar11->sin_zero;
          uVar3 = *(undefined4 *)(psVar11->sin_zero + 4);
          sendaddress[num_connected].sin_family = psVar11->sin_family;
          sendaddress[num_connected].sin_port = iVar5;
          sendaddress[num_connected].sin_addr.s_addr = iVar1;
          *(undefined4 *)sendaddress[num_connected].sin_zero = uVar2;
          *(undefined4 *)(sendaddress[num_connected].sin_zero + 4) = uVar3;
          (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Got connect from node %d.");
          num_connected = (int)doomcom.numnodes;
        }
      }
      SendConAck(num_connected,num_needed);
    }
  } while( true );
  if (doomcom.numnodes < num_needed) {
    SendConAck((int)doomcom.numnodes,num_needed);
    bVar7 = false;
  }
  else {
    do {
      psVar11 = PreGet(&packet,0x44,false);
      if (psVar11 == (sockaddr_in *)0x0) goto LAB_0046646e;
    } while ((packet.Fake != '0') || (packet.Message != '\x02'));
    uVar10 = FindNode(psVar11);
    if (-1 < (int)uVar10) {
      sVar8 = doomcom.numnodes + -1;
      doomcom.numnodes = sVar8;
      psVar11 = sendaddress + (ulong)uVar10 + 1;
      for (; (int)uVar10 < (int)sVar8; uVar10 = uVar10 + 1) {
        iVar5 = psVar11->sin_port;
        iVar6.s_addr = (psVar11->sin_addr).s_addr;
        uVar4 = *(undefined8 *)psVar11->sin_zero;
        psVar11[-1].sin_family = psVar11->sin_family;
        psVar11[-1].sin_port = iVar5;
        psVar11[-1].sin_addr = (in_addr)iVar6.s_addr;
        *(undefined8 *)psVar11[-1].sin_zero = uVar4;
        psVar11 = psVar11 + 1;
      }
      SendConAck((int)sVar8,num_needed);
    }
LAB_0046646e:
    bVar7 = num_needed <= doomcom.numnodes;
  }
  return bVar7;
}

Assistant:

bool Host_CheckForConnects (void *userdata)
{
	PreGamePacket packet;
	int numplayers = (int)(intptr_t)userdata;
	sockaddr_in *from;
	int node;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONNECT:
			node = FindNode (from);
			if (doomcom.numnodes == numplayers)
			{
				if (node == -1)
				{
					const BYTE *s_addr_bytes = (const BYTE *)&from->sin_addr;
					StartScreen->NetMessage ("Got extra connect from %d.%d.%d.%d:%d",
						s_addr_bytes[0], s_addr_bytes[1], s_addr_bytes[2], s_addr_bytes[3],
						from->sin_port);
					packet.Message = PRE_ALLFULL;
					PreSend (&packet, 2, from);
				}
			}
			else
			{
				if (node == -1)
				{
					node = doomcom.numnodes++;
					sendaddress[node] = *from;
					StartScreen->NetMessage ("Got connect from node %d.", node);
				}

				// Let the new guest (and everyone else) know we got their message.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_DISCONNECT:
			node = FindNode (from);
			if (node >= 0)
			{
				StartScreen->NetMessage ("Got disconnect from node %d.", node);
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}

				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_KEEPALIVE:
			break;
		}
	}
	if (doomcom.numnodes < numplayers)
	{
		// Send message to everyone as a keepalive
		SendConAck(doomcom.numnodes, numplayers);
		return false;
	}

	// It's possible somebody bailed out after all players were found.
	// Unfortunately, this isn't guaranteed to catch all of them.
	// Oh well. Better than nothing.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_DISCONNECT)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}
				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;
		}
	}
	return doomcom.numnodes >= numplayers;
}